

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

void coda_strfl(double a,char *s)

{
  int iVar1;
  char *s_local;
  double a_local;
  
  iVar1 = coda_isNaN(a);
  if (iVar1 == 0) {
    iVar1 = coda_isPlusInf(a);
    if (iVar1 == 0) {
      iVar1 = coda_isMinInf(a);
      if (iVar1 == 0) {
        sprintf(s,"%.16g",a);
      }
      else {
        strcpy(s,"-inf");
      }
    }
    else {
      strcpy(s,"+inf");
    }
  }
  else {
    strcpy(s,"nan");
  }
  return;
}

Assistant:

LIBCODA_API void coda_strfl(double a, char *s)
{
    if (coda_isNaN(a))
    {
        strcpy(s, "nan");
    }
    else if (coda_isPlusInf(a))
    {
        strcpy(s, "+inf");
    }
    else if (coda_isMinInf(a))
    {
        strcpy(s, "-inf");
    }
    else
    {
        sprintf(s, "%.16g", a);
    }
}